

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  LoadStoreTracking *this_00;
  Type t;
  pointer ppMVar1;
  Memory *args;
  pointer ppGVar2;
  Global *args_00;
  pointer ppTVar3;
  Table *args_01;
  pointer ppDVar4;
  DataSegment *pDVar5;
  pointer ppFVar6;
  Func *f;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  size_type sVar7;
  bool bVar8;
  Module *pMVar9;
  pointer pTVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  pointer ppDVar11;
  pointer ppFVar12;
  char **ppcVar13;
  Index index;
  Index extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Index IVar15;
  char (*args_2) [2];
  Index i;
  ulong uVar16;
  Index i_1;
  pointer ppMVar17;
  pointer ppGVar18;
  pointer ppTVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  _Alloc_hider _Var20;
  char (*in_stack_fffffffffffffe88) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string local_118;
  string ds;
  undefined8 uVar14;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar9 = (this->mc).module;
  ppMVar1 = (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  for (ppMVar17 = (pMVar9->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar17 != ppMVar1; ppMVar17 = ppMVar17 + 1) {
    args = *ppMVar17;
    name_00.data_ = (args->name)._M_dataplus._M_p;
    name_00.size_ = (args->name)._M_string_length;
    IVar15 = (Index)args_1;
    bVar8 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar15,name_00);
    cat<char[8],std::__cxx11::string>(&ds,(wabt *)"memory ",(char (*) [8])args,args_1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar8) {
      std::__cxx11::to_string(&name,(args->page_limits).initial);
      std::__cxx11::to_string(&local_118,(args->page_limits).max);
      cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&ds,(wabt *)"(initial: ",(char (*) [11])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x199e61,
                 (char (*) [2])in_stack_fffffffffffffe88);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(IVar15 + 1);
  }
  pMVar9 = (this->mc).module;
  if ((pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar9->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar9 = (this->mc).module;
  }
  ppGVar2 = (pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  IVar15 = 0;
  for (ppGVar18 = (pMVar9->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppGVar18 != ppGVar2; ppGVar18 = ppGVar18 + 1) {
    args_00 = *ppGVar18;
    ppcVar13 = (char **)(args_00->name)._M_string_length;
    name_01.data_ = (args_00->name)._M_dataplus._M_p;
    name_01.size_ = (args_00->name)._M_string_length;
    bVar8 = CheckImportExport(this,__return_storage_ptr__,Global,IVar15,name_01);
    name._M_dataplus._M_p = GetDecompTypeName((Type)(args_00->type).enum_);
    args_1_00 = ":";
    cat<char[8],std::__cxx11::string,char[2],char_const*>
              (&ds,(wabt *)"global ",(char (*) [8])args_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&name,ppcVar13);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar8) {
      InitExp_abi_cxx11_(&name,this,&args_00->init_expr);
      cat<char[4],std::__cxx11::string>
                (&ds,(wabt *)0x18da5b,(char (*) [4])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    IVar15 = IVar15 + 1;
  }
  pMVar9 = (this->mc).module;
  if ((pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar9->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar9 = (this->mc).module;
  }
  ppTVar3 = (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  IVar15 = 0;
  for (ppTVar19 = (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar19 != ppTVar3;
      ppTVar19 = ppTVar19 + 1) {
    args_01 = *ppTVar19;
    ppcVar13 = (char **)(args_01->name)._M_string_length;
    name_02.data_ = (args_01->name)._M_dataplus._M_p;
    name_02.size_ = (args_01->name)._M_string_length;
    bVar8 = CheckImportExport(this,__return_storage_ptr__,Table,IVar15,name_02);
    name._M_dataplus._M_p = GetDecompTypeName((Type)(args_01->elem_type).enum_);
    cat<char[7],std::__cxx11::string,char[2],char_const*>
              (&ds,(wabt *)"table ",(char (*) [7])args_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&name,ppcVar13);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar8) {
      std::__cxx11::to_string(&name,(args_01->elem_limits).initial);
      std::__cxx11::to_string(&local_118,(args_01->elem_limits).max);
      cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&ds,(wabt *)"(min: ",(char (*) [7])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x199e61,
                 (char (*) [2])in_stack_fffffffffffffe88);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    IVar15 = IVar15 + 1;
  }
  pMVar9 = (this->mc).module;
  if ((pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar9->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar9 = (this->mc).module;
  }
  ppDVar4 = (pMVar9->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar11 = (pMVar9->data_segments).
                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppDVar11 != ppDVar4;
      ppDVar11 = ppDVar11 + 1) {
    pDVar5 = *ppDVar11;
    InitExp_abi_cxx11_(&name,this,&pDVar5->offset);
    cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[5]>
              (&ds,(wabt *)"data ",(char (*) [6])&pDVar5->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
               (char (*) [10])&name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") = ",
               in_stack_fffffffffffffe88);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    BinaryToString_abi_cxx11_(&ds,this,&pDVar5->data);
    if (this->target_exp_width >> 1 < ds._M_string_length) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
  }
  pMVar9 = (this->mc).module;
  if ((pMVar9->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar9->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar9 = (this->mc).module;
  }
  ppFVar6 = (pMVar9->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = &this->lst;
  IVar15 = 0;
  for (ppFVar12 = (pMVar9->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar12 != ppFVar6;
      ppFVar12 = ppFVar12 + 1) {
    f = *ppFVar12;
    this->cur_func = f;
    args_2 = (char (*) [2])(f->name)._M_dataplus._M_p;
    name_03.data_ = (f->name)._M_dataplus._M_p;
    name_03.size_ = (f->name)._M_string_length;
    bVar8 = CheckImportExport(this,__return_storage_ptr__,First,IVar15,name_03);
    AST::AST((AST *)&ds,&this->mc,f);
    this->cur_ast = (AST *)&ds;
    if (!bVar8) {
      AST::Construct((AST *)&ds,&f->exprs,
                     (Index)((ulong)((long)(f->decl).sig.result_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(f->decl).sig.result_types.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2),true);
      LoadStoreTracking::Track(this_00,(Node *)ds._M_string_length);
      LoadStoreTracking::CheckLayouts(this_00);
    }
    cat<char[10],std::__cxx11::string,char[2]>
              (&name,(wabt *)"function ",(char (*) [10])f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18e4c3,args_2)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    uVar16 = 0;
    uVar14 = extraout_RDX;
    while( true ) {
      index = (Index)uVar14;
      pTVar10 = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((ulong)((long)(f->decl).sig.param_types.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pTVar10) >> 2 & 0xffffffff) <=
          uVar16) break;
      if (uVar16 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pTVar10 = (f->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        index = extraout_EDX;
      }
      t.enum_ = pTVar10[uVar16].enum_;
      IndexToAlphaName_abi_cxx11_(&local_118,(wabt *)(uVar16 & 0xffffffff),index);
      std::operator+(&name,"$",&local_118);
      std::__cxx11::string::_M_dispose();
      LocalDecl(&local_118,this,&name,t);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      uVar16 = uVar16 + 1;
      uVar14 = extraout_RDX_00;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pTVar10 = (f->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppcVar13 = (char **)((ulong)((long)(f->decl).sig.result_types.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10) >>
                        2);
    if ((int)ppcVar13 != 0) {
      if ((int)ppcVar13 == 1) {
        local_118._M_dataplus._M_p = GetDecompTypeName((Type)pTVar10->enum_);
        cat<char[2],char_const*>(&name,(wabt *)":",(char (*) [2])&local_118,ppcVar13);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        for (uVar16 = 0;
            pTVar10 = (f->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
            uVar16 < ((ulong)((long)(f->decl).sig.result_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10) >> 2
                     & 0xffffffff); uVar16 = uVar16 + 1) {
          if (uVar16 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pTVar10 = (f->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          GetDecompTypeName((Type)pTVar10[uVar16].enum_);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    if (bVar8) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      DecompileExpr((Value *)&name,this,(Node *)ds._M_string_length,(Node *)0x0);
      IndentValue(this,(Value *)&name,this->indent_amount,(string_view)ZEXT816(0));
      sVar7 = name._M_string_length;
      for (_Var20 = name._M_dataplus; _Var20._M_p != (pointer)sVar7;
          _Var20._M_p = _Var20._M_p + 0x20) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ModuleContext::EndFunc(&this->mc);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
             *)this_00);
    IVar15 = IVar15 + 1;
    this->cur_func = (Func *)0x0;
    this->cur_ast = (AST *)0x0;
    AST::~AST((AST *)&ds);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") = ");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }